

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_timing.cpp
# Opt level: O0

void Am_Register_Timer(Am_Time *wait_time,Am_Object *obj,Am_Slot_Key method_slot,bool once)

{
  Am_Interactor_Time_Event *this;
  Am_Object local_48 [3];
  Am_Time local_30;
  Am_Interactor_Time_Event *local_28;
  Am_Interactor_Time_Event *new_event;
  bool once_local;
  Am_Object *pAStack_18;
  Am_Slot_Key method_slot_local;
  Am_Object *obj_local;
  Am_Time *wait_time_local;
  
  new_event._5_1_ = once;
  new_event._6_2_ = method_slot;
  pAStack_18 = obj;
  obj_local = (Am_Object *)wait_time;
  this = (Am_Interactor_Time_Event *)operator_new(0x28);
  Am_Time::Am_Time(&local_30,wait_time);
  Am_Object::Am_Object(local_48,obj);
  Am_Interactor_Time_Event::Am_Interactor_Time_Event
            (this,&local_30,local_48,new_event._6_2_,(bool)(new_event._5_1_ & 1));
  Am_Object::~Am_Object(local_48);
  Am_Time::~Am_Time(&local_30);
  local_28 = this;
  am_add_timing_event(this);
  return;
}

Assistant:

void
Am_Register_Timer(Am_Time wait_time, Am_Object obj, Am_Slot_Key method_slot,
                  bool once)
{
  Am_Interactor_Time_Event *new_event =
      new Am_Interactor_Time_Event(wait_time, obj, method_slot, once);
  am_add_timing_event(new_event);
}